

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O3

void __thiscall
directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>::
for_each_cell<directed_flag_complex_in_memory_computer::compute_filtration_t>
          (directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *this,
          compute_filtration_t *f,int min_dimension,int max_dimension,vertex_index_t *prefix,
          int prefix_size)

{
  map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
  *pmVar1;
  _Rb_tree_node_base *p_Var2;
  pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_> child;
  _Base_ptr p_Stack_50;
  _Base_ptr local_48;
  _Base_ptr p_Stack_40;
  
  prefix[prefix_size] = this->vertex;
  if (min_dimension <= prefix_size) {
    directed_flag_complex_in_memory_computer::compute_filtration_t::operator()
              (f,prefix,prefix_size + 1,&this->data);
  }
  if ((prefix_size != max_dimension) &&
     (pmVar1 = this->children,
     pmVar1 != (map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
                *)0x0)) {
    for (p_Var2 = (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      p_Stack_50 = p_Var2[1]._M_parent;
      local_48 = p_Var2[1]._M_left;
      p_Stack_40 = p_Var2[1]._M_right;
      for_each_cell<directed_flag_complex_in_memory_computer::compute_filtration_t>
                ((directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *)&p_Stack_50,f,
                 min_dimension,max_dimension,prefix,prefix_size + 1);
    }
  }
  return;
}

Assistant:

void for_each_cell(Func& f, int min_dimension, int max_dimension, vertex_index_t* prefix, int prefix_size = 0) {
		prefix[prefix_size++] = vertex;
		if (prefix_size >= min_dimension + 1) f(prefix, prefix_size, data);
		if (prefix_size == max_dimension + 1 || children == nullptr) return;

		for (auto child : *children) child.second.for_each_cell(f, min_dimension, max_dimension, prefix, prefix_size);
	}